

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenNativeTable(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  pointer ppFVar1;
  pointer ppFVar2;
  string native_name;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  EscapeKeyword(&local_108,this,(string *)struct_def);
  NativeName(&local_c8,&local_108,struct_def,&(this->opts_).super_IDLOptions);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"STRUCT_NAME",&local_109);
  EscapeKeyword(&local_e8,this,(string *)struct_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"NATIVE_NAME",(allocator<char> *)&local_e8);
  CodeWriter::SetValue(this_00,&local_108,&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {",
             (allocator<char> *)&local_108);
  CodeWriter::operator+=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"  typedef {{STRUCT_NAME}} TableType;",
             (allocator<char> *)&local_108);
  CodeWriter::operator+=(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  GenFullyQualifiedNameGetter(this,struct_def,&local_c8);
  ppFVar1 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1;
      ppFVar2 = ppFVar2 + 1) {
    GenMember(this,*ppFVar2);
  }
  GenOperatorNewDelete(this,struct_def);
  GenDefaultConstructor(this,struct_def);
  GenCopyMoveCtorAndAssigOpDecls(this,struct_def);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"};",(allocator<char> *)&local_108);
  CodeWriter::operator+=(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"",(allocator<char> *)&local_108);
  CodeWriter::operator+=(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void GenNativeTable(const StructDef &struct_def) {
    const auto native_name = NativeName(Name(struct_def), &struct_def, opts_);
    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME", native_name);

    // Generate a C++ object that can hold an unpacked version of this table.
    code_ += "struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {";
    code_ += "  typedef {{STRUCT_NAME}} TableType;";
    GenFullyQualifiedNameGetter(struct_def, native_name);
    for (const auto field : struct_def.fields.vec) { GenMember(*field); }
    GenOperatorNewDelete(struct_def);
    GenDefaultConstructor(struct_def);
    GenCopyMoveCtorAndAssigOpDecls(struct_def);
    code_ += "};";
    code_ += "";
  }